

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRTreeBuildVisitor.cpp
# Opt level: O3

void __thiscall IRTreeBuildVisitor::Visit(IRTreeBuildVisitor *this,PrintStatement *statement)

{
  int iVar1;
  ExpressionList *this_00;
  SubtreeWrapper *pSVar2;
  undefined4 extraout_var;
  ExpressionWrapper *this_01;
  CallExpression *this_02;
  NameExpression *this_03;
  string local_70;
  Label local_50;
  
  this_00 = (ExpressionList *)operator_new(0x20);
  (this_00->super_BaseElement)._vptr_BaseElement = (_func_int **)&PTR__ExpressionList_0016cf38;
  (this_00->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar2 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                     (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                      &statement->expression_->super_Node);
  iVar1 = (*pSVar2->_vptr_SubtreeWrapper[2])(pSVar2);
  IRT::ExpressionList::Add(this_00,(Expression *)CONCAT44(extraout_var,iVar1));
  this_01 = (ExpressionWrapper *)operator_new(0x10);
  this_02 = (CallExpression *)operator_new(0x18);
  this_03 = (NameExpression *)operator_new(0x28);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"print","");
  IRT::Label::Label(&local_50,&local_70);
  IRT::NameExpression::NameExpression(this_03,&local_50);
  IRT::CallExpression::CallExpression(this_02,(Expression *)this_03,this_00);
  IRT::ExpressionWrapper::ExpressionWrapper(this_01,(Expression *)this_02);
  (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)this_01;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.label_._M_dataplus._M_p != &local_50.label_.field_2) {
    operator_delete(local_50.label_._M_dataplus._M_p,
                    local_50.label_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void IRTreeBuildVisitor::Visit(PrintStatement* statement) {
  auto* irt_expressions = new IRT::ExpressionList();
  irt_expressions->Add(Accept(statement->expression_)->ToExpression());

  tos_value_ = new IRT::ExpressionWrapper(new IRT::CallExpression(
      new IRT::NameExpression(IRT::Label("print")), irt_expressions));
}